

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O1

void arkInterpFree_Lagrange(void *arkode_mem,ARKInterp I)

{
  int iVar1;
  void *__ptr;
  int *piVar2;
  long lVar3;
  long lVar4;
  int iVar6;
  undefined1 auVar5 [16];
  
  if (I == (ARKInterp)0x0 || arkode_mem == (void *)0x0) {
    return;
  }
  if (I->content != (void *)0x0) {
    if (*(long *)((long)I->content + 8) != 0) {
      piVar2 = (int *)I->content;
      if (0 < *piVar2) {
        lVar4 = 0;
        lVar3 = 0;
        do {
          if (*(long *)(*(long *)(piVar2 + 2) + lVar4) != 0) {
            arkFreeVec((ARKodeMem)arkode_mem,(N_Vector *)(*(long *)(piVar2 + 2) + lVar4));
            *(undefined8 *)(*(long *)((long)I->content + 8) + lVar4) = 0;
          }
          lVar3 = lVar3 + 1;
          piVar2 = (int *)I->content;
          lVar4 = lVar4 + 8;
        } while (lVar3 < *piVar2);
      }
      free(*(void **)(piVar2 + 2));
      *(undefined8 *)((long)I->content + 8) = 0;
    }
    __ptr = *(void **)((long)I->content + 0x10);
    if (__ptr != (void *)0x0) {
      free(__ptr);
      *(undefined8 *)((long)I->content + 0x10) = 0;
    }
    piVar2 = (int *)I->content;
    iVar1 = *piVar2;
    iVar6 = iVar1 + 1;
    auVar5._4_4_ = iVar1 + 2;
    auVar5._8_4_ = auVar5._4_4_;
    auVar5._12_4_ = -(uint)(auVar5._4_4_ < 0);
    *(long *)((long)arkode_mem + 0x218) =
         *(long *)((long)arkode_mem + 0x218) - CONCAT44(-(uint)(iVar6 < 0),iVar6);
    *(long *)((long)arkode_mem + 0x220) = *(long *)((long)arkode_mem + 0x220) - auVar5._8_8_;
    free(piVar2);
    I->content = (void *)0x0;
  }
  if (I->ops != (ARKInterpOps)0x0) {
    free(I->ops);
    I->ops = (ARKInterpOps)0x0;
  }
  free(I);
  return;
}

Assistant:

void arkInterpFree_Lagrange(void* arkode_mem, ARKInterp I)
{
  int i;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return;
  ark_mem = (ARKodeMem) arkode_mem;

  /* if interpolation structure is NULL, just return */
  if (I == NULL) return;

  /* free content */
  if (I->content != NULL) {
    if (LINT_YHIST(I) != NULL) {
      for (i=0; i<LINT_NMAX(I); i++) {
        if (LINT_YJ(I,i) != NULL) {
          arkFreeVec(ark_mem, &(LINT_YJ(I,i)));
          LINT_YJ(I,i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
    if (LINT_THIST(I) != NULL) {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }

    /* update work space sizes */
    ark_mem->lrw -= (LINT_NMAX(I) + 1);
    ark_mem->liw -= (LINT_NMAX(I) + 2);

    free(I->content);
    I->content = NULL;
  }

  /* free ops and interpolation structures */
  if (I->ops) {
    free(I->ops);
    I->ops = NULL;
  }
  free(I);
  I = NULL;

  return;
}